

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots.cpp
# Opt level: O2

void * parseFeatureDict(SymbolContext<char> *ctx)

{
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *this;
  size_t __nbytes;
  void *__buf;
  SymbolContext<char> local_38;
  
  if (ctx->num_values < 1) {
    this = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *)0x0;
  }
  else {
    this = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            *)operator_new(0x60);
    __nbytes = 0;
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument(this,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                      (CrtAllocator *)0x0);
    Centaurus::SymbolContext<char>::read_abi_cxx11_(&local_38,(int)ctx,__buf,__nbytes);
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
    ::Parse<0u,rapidjson::UTF8<char>>
              ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                *)this,(Ch *)local_38.context);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return this;
}

Assistant:

void *parseFeatureDict(const SymbolContext<char>& ctx)
{
  if (ctx.count() > 0) {
    auto ret = new rapidjson::Document;
    ret->Parse(ctx.read().c_str());
    return ret;
  }
  return nullptr;
}